

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O3

void cipher_freectx(void *vgctx)

{
  EVP_CIPHER_CTX_free(*(EVP_CIPHER_CTX **)((long)vgctx + 0x20));
  CRYPTO_free(vgctx);
  return;
}

Assistant:

static void cipher_freectx(void *vgctx)
{
    GOST_CTX *gctx = vgctx;

    /*
     * We don't free gctx->cipher here.
     * That will be done by the provider teardown, via
     * GOST_prov_deinit_ciphers() (defined at the bottom of this file).
     */
    EVP_CIPHER_CTX_free(gctx->cctx);
    OPENSSL_free(gctx);
}